

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O0

void expr_dsp(t_expr *x,t_signal **sp)

{
  int iVar1;
  int iVar2;
  t_float *ptVar3;
  uint local_20;
  int newsize;
  int nv;
  int i;
  t_signal **sp_local;
  t_expr *x_local;
  
  x->exp_error = 0;
  iVar2 = x->exp_vsize;
  iVar1 = (*sp)->s_n;
  x->exp_vsize = (*sp)->s_n;
  for (newsize = 0; newsize < x->exp_nexpr; newsize = newsize + 1) {
    x->exp_res[newsize].ex_type = 0xf;
    x->exp_res[newsize].ex_cont =
         (anon_union_8_5_735de1bb_for_ex_cont)sp[x->exp_nivec + newsize]->s_vec;
  }
  local_20 = 0;
  for (newsize = 0; newsize < 100; newsize = newsize + 1) {
    if (((newsize == 0) || (x->exp_var[newsize].ex_type == 0xe)) ||
       (x->exp_var[newsize].ex_type == 0x12)) {
      if (x->exp_nivec <= (int)local_20) {
        post("expr_dsp int. err nv = %d, x->exp_nive = %d",(ulong)local_20,(ulong)(uint)x->exp_nivec
            );
        abort();
      }
      x->exp_var[newsize].ex_cont = (anon_union_8_5_735de1bb_for_ex_cont)sp[(int)local_20]->s_vec;
      local_20 = local_20 + 1;
    }
  }
  if ((local_20 != x->exp_nivec) && ((local_20 != 0 || (x->exp_nivec != 1)))) {
    post("expr_dsp internal error 2 nv = %d, x->exp_nive = %d",(ulong)local_20,
         (ulong)(uint)x->exp_nivec);
    abort();
  }
  dsp_add(expr_perform,1,x);
  if (x->exp_p_res[0] != (t_float *)0x0) {
    if (iVar2 == iVar1) {
      return;
    }
    for (newsize = 0; newsize < x->exp_nexpr; newsize = newsize + 1) {
      free(x->exp_p_res[newsize]);
      free(x->exp_tmpres[newsize]);
    }
    for (newsize = 0; newsize < 100; newsize = newsize + 1) {
      free(x->exp_p_var[newsize]);
    }
  }
  for (newsize = 0; newsize < x->exp_nexpr; newsize = newsize + 1) {
    ptVar3 = (t_float *)calloc((long)x->exp_vsize,4);
    x->exp_p_res[newsize] = ptVar3;
    ptVar3 = (t_float *)calloc((long)x->exp_vsize,4);
    x->exp_tmpres[newsize] = ptVar3;
  }
  for (newsize = 0; newsize < 100; newsize = newsize + 1) {
    ptVar3 = (t_float *)calloc((long)x->exp_vsize,4);
    x->exp_p_var[newsize] = ptVar3;
  }
  return;
}

Assistant:

static void
expr_dsp(t_expr *x, t_signal **sp)
{
        int i, nv;
        int newsize;

        x->exp_error = 0;               /* reset all errors */
        newsize = (x->exp_vsize !=  sp[0]->s_n);
        x->exp_vsize = sp[0]->s_n;      /* record the vector size */
        for (i = 0; i < x->exp_nexpr; i++) {
                x->exp_res[i].ex_type = ET_VEC;
                x->exp_res[i].ex_vec =  sp[x->exp_nivec + i]->s_vec;
        }
        for (i = 0, nv = 0; i < MAX_VARS; i++)
                /*
                 * the first inlet is always a signal
                 *
                 * SDY  We are warning the user till this limitation
                 * is taken away from pd
                 */
                if (!i || x->exp_var[i].ex_type == ET_VI ||
                                        x->exp_var[i].ex_type == ET_XI) {
                        if (nv >= x->exp_nivec) {
                          post("expr_dsp int. err nv = %d, x->exp_nive = %d",
                                                          nv,  x->exp_nivec);
                          abort();
                        }
                        x->exp_var[i].ex_vec  = sp[nv]->s_vec;
                        nv++;
                }
        /* we always have one inlet but we may not use it */
        if (nv != x->exp_nivec && (nv != 0 ||  x->exp_nivec != 1)) {
                post("expr_dsp internal error 2 nv = %d, x->exp_nive = %d",
                                                          nv,  x->exp_nivec);
                abort();
        }

        dsp_add(expr_perform, 1, (t_int *) x);

        /*
         * The buffer are now being allocated for expr~ and fexpr~
         * because if we have more than one expression we need the
         * temporary buffers, The save buffers are not really needed
        if (!IS_FEXPR_TILDE(x))
                return;
         */
        /*
         * if we have already allocated the buffers and we have a
         * new size free all the buffers
         */
        if (x->exp_p_res[0]) {
                if (!newsize)
                        return;
                /*
                 * if new size, reallocate all the previous buffers for fexpr~
                 */
                for (i = 0; i < x->exp_nexpr; i++) {
                        fts_free(x->exp_p_res[i]);
                        fts_free(x->exp_tmpres[i]);
                }
                for (i = 0; i < MAX_VARS; i++)
                        fts_free(x->exp_p_var[i]);

        }
        for (i = 0; i < x->exp_nexpr; i++) {
                x->exp_p_res[i] = fts_calloc(x->exp_vsize, sizeof (t_float));
                x->exp_tmpres[i] = fts_calloc(x->exp_vsize, sizeof (t_float));
        }
        for (i = 0; i < MAX_VARS; i++)
                x->exp_p_var[i] = fts_calloc(x->exp_vsize, sizeof (t_float));
}